

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O0

void __thiscall despot::RegDemo::RegDemo(RegDemo *this)

{
  istringstream local_210 [8];
  istringstream iss;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string map;
  RegDemo *this_local;
  
  despot::DSPOMDP::DSPOMDP(&this->super_DSPOMDP);
  MDP::MDP(&this->super_MDP);
  StateIndexer::StateIndexer(&this->super_StateIndexer);
  StatePolicy::StatePolicy(&this->super_StatePolicy);
  *(undefined ***)this = &PTR__RegDemo_00126ac0;
  *(undefined ***)&this->super_MDP = &PTR__RegDemo_00126bd0;
  *(undefined ***)&this->super_StateIndexer = &PTR__RegDemo_00126c20;
  *(undefined ***)&this->super_StatePolicy = &PTR__RegDemo_00126c58;
  std::vector<double,_std::allocator<double>_>::vector(&this->trap_prob_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->obs_);
  std::vector<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::vector
            (&this->states_);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::vector(&this->transition_probabilities_);
  MemoryPool<despot::RegDemoState>::MemoryPool(&this->memory_pool_);
  std::vector<int,_std::allocator<int>_>::vector(&this->default_action_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"mapSize = 7\n",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"0 0 0 0.75 0.75 0.75 500\n",&local_89);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::istringstream::istringstream(local_210,(string *)local_40,_S_in);
  Init(this,(istream *)local_210);
  std::__cxx11::istringstream::~istringstream(local_210);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

RegDemo::RegDemo() {
	string map = string("mapSize = 7\n") + string("0 0 0 0.75 0.75 0.75 500\n");
	istringstream iss(map);
	Init(iss);
}